

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

bool __thiscall
slang::driver::Driver::runPreprocessor
          (Driver *this,bool includeComments,bool includeDirectives,bool obfuscateIds,
          bool useFixedObfuscationSeed)

{
  group_type_pointer pgVar1;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *paVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  value_type_pointer ppVar19;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  undefined8 uVar22;
  undefined8 *puVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar40;
  value_type_pointer ppVar41;
  group_type_pointer pgVar42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar43;
  bool bVar44;
  bool bVar45;
  undefined4 uVar46;
  int iVar47;
  uint64_t uVar48;
  result_type rVar49;
  uint uVar50;
  undefined7 in_register_00000009;
  value_type_pointer ppVar51;
  Diagnostic *diag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar52;
  undefined8 uVar53;
  SourceManager *this_00;
  undefined4 uVar54;
  ulong uVar55;
  group_type_pointer pgVar56;
  path *ctx;
  __extent_storage<18446744073709551615UL> args_1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  char *pcVar57;
  long lVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  uchar uVar69;
  uchar uVar70;
  uchar uVar71;
  uchar uVar72;
  uchar uVar73;
  uchar uVar74;
  uchar uVar75;
  uchar uVar76;
  span<const_slang::Diagnostic,_18446744073709551615UL> diags;
  string_view sVar77;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  string_view text;
  string_view text_00;
  value_type *elements;
  flat_hash_map<std::string,_std::string> obfuscationMap;
  BumpAllocator alloc;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> buffers;
  Bag optionBag;
  Diagnostics diagnostics;
  random_device dev;
  string newName;
  Preprocessor preprocessor;
  array<unsigned_int,_1248UL> seed;
  try_emplace_args_t local_543d;
  undefined4 local_543c;
  seed_seq local_5438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5420;
  undefined8 *local_5418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5410;
  ulong local_5408;
  value_type_pointer local_5400;
  group_type_pointer local_53f8;
  path *local_53f0;
  undefined8 *local_53e8;
  undefined1 local_53e0 [24];
  value_type_pointer ppStack_53c8;
  ulong local_53c0;
  ulong local_53b8;
  BumpAllocator local_53b0;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> local_53a0;
  uchar local_5388;
  uchar uStack_5387;
  uchar uStack_5386;
  uchar uStack_5385;
  uchar uStack_5384;
  uchar uStack_5383;
  uchar uStack_5382;
  uchar uStack_5381;
  uchar uStack_5380;
  uchar uStack_537f;
  uchar uStack_537e;
  uchar uStack_537d;
  uchar uStack_537c;
  uchar uStack_537b;
  uchar uStack_537a;
  uchar uStack_5379;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_5378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5370;
  group_type_pointer local_5368;
  DiagnosticEngine *local_5360;
  SyntaxPrinter local_5358;
  undefined1 local_5328 [16];
  undefined1 local_5318 [32];
  size_t local_52f8;
  size_t local_52f0;
  undefined1 local_52e8 [248];
  undefined1 local_51f0 [16];
  path local_51e0 [124];
  undefined1 local_3e68 [5000];
  Preprocessor local_2ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2748 [156];
  uint local_13c8 [2];
  optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  local_13c0;
  
  local_543c = (undefined4)CONCAT71(in_register_00000009,obfuscateIds);
  local_5318._0_8_ = (pointer)0x3f;
  local_5318._8_8_ = 1;
  local_5318._16_16_ = ZEXT816(0x49b460);
  local_52f8 = 0;
  local_52f0 = 0;
  addParseOptions(this,(Bag *)local_5318);
  BumpAllocator::BumpAllocator(&local_53b0);
  local_52e8._0_8_ = local_52e8 + 0x18;
  local_52e8._8_8_ = (pointer)0x0;
  local_52e8._16_8_ = 2;
  local_5360 = (DiagnosticEngine *)&this->sourceManager;
  local_5328 = (undefined1  [16])0x0;
  args_1._M_extent_value = (size_t)local_5318;
  parsing::Preprocessor::Preprocessor
            (&local_2ae0,(SourceManager *)local_5360,&local_53b0,(Diagnostics *)local_52e8,
             (Bag *)args_1._M_extent_value,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  SourceLoader::loadSources(&local_53a0,&this->sourceLoader);
  for (; uVar54 = local_543c,
      local_53a0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_53a0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_start;
      local_53a0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_53a0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1) {
    parsing::Preprocessor::pushSource
              (&local_2ae0,
               local_53a0.
               super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>._M_impl
               .super__Vector_impl_data._M_finish[-1]);
  }
  local_5358.buffer._M_dataplus._M_p = (pointer)&local_5358.buffer.field_2;
  local_5358.buffer._M_string_length = 0;
  local_5358.buffer.field_2._M_local_buf[0] = '\0';
  local_5358.sourceManager = (SourceManager *)0x0;
  local_5358.includePreprocessed = true;
  local_5358.squashNewlines = true;
  local_5358.includeDirectives = includeDirectives;
  local_5358._40_3_ = 1;
  local_53e0._0_8_ = 0x3f;
  local_53e0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  stack0xffffffffffffac30 = ZEXT816(0x49b460);
  local_53c0 = 0;
  local_13c0.
  super__Optional_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ._M_engaged = false;
  local_53b8 = 0;
  local_5358.includeComments = includeComments;
  if ((char)local_543c != '\0') {
    if (useFixedObfuscationSeed) {
      std::
      optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
      ::emplace<>(&local_13c0);
    }
    else {
      pbVar52 = local_2748;
      memset(pbVar52,0,0x1380);
      std::random_device::random_device((random_device *)local_51f0);
      uVar55 = 0x4e1;
      do {
        uVar46 = std::random_device::_M_getval();
        *(undefined4 *)&(pbVar52->_M_dataplus)._M_p = uVar46;
        pbVar52 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(pbVar52->_M_dataplus)._M_p + 4);
        uVar55 = uVar55 - 1;
      } while (1 < uVar55);
      std::seed_seq::seed_seq<unsigned_int*>(&local_5438,(uint *)local_2748,local_13c8);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed<std::seed_seq>
                ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)local_3e68,&local_5438);
      if (local_5438._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5438._M_v.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_5438._M_v.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5438._M_v.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::random_device::_M_fini();
      bVar44 = local_13c0.
               super__Optional_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
               ._M_engaged;
      memcpy(&local_13c0,local_3e68,5000);
      if (bVar44 == false) {
        local_13c0.
        super__Optional_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ._M_engaged = true;
      }
    }
  }
  do {
    local_5438._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._0_16_ = parsing::Preprocessor::next(&local_2ae0);
    if ((TokenKind)
        local_5438._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == IntegerBase) {
      do {
        slang::syntax::SyntaxPrinter::print
                  (&local_5358,
                   (Token)local_5438._M_v.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._0_16_);
        local_5438._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._0_16_ = parsing::Preprocessor::next(&local_2ae0);
        bVar44 = slang::syntax::SyntaxFacts::isPossibleVectorDigit
                           ((TokenKind)
                            local_5438._M_v.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      } while (bVar44);
    }
    if (((char)uVar54 != '\0') &&
       ((TokenKind)
        local_5438._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == Identifier)) {
      sVar77 = parsing::Token::valueText((Token *)&local_5438);
      local_51f0._0_8_ = local_51e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_51f0,sVar77._M_str,sVar77._M_str + sVar77._M_len);
      uVar22 = local_51f0._8_8_;
      local_53f0 = (path *)local_51f0._0_8_;
      uVar48 = detail::hashing::hash((void *)local_51f0._0_8_,local_51f0._8_8_);
      uVar55 = uVar48 >> ((byte)local_53e0[0] & 0x3f);
      lVar58 = (uVar48 & 0xff) * 4;
      uVar61 = (&UNK_0049b57c)[lVar58];
      uVar62 = (&UNK_0049b57d)[lVar58];
      uVar63 = (&UNK_0049b57e)[lVar58];
      uVar64 = (&UNK_0049b57f)[lVar58];
      local_5400 = ppStack_53c8;
      local_5410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_53e0._8_8_;
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      local_53f8 = (group_type_pointer)local_53e0._16_8_;
      uVar65 = uVar61;
      uVar66 = uVar62;
      uVar67 = uVar63;
      uVar68 = uVar64;
      uVar69 = uVar61;
      uVar70 = uVar62;
      uVar71 = uVar63;
      uVar72 = uVar64;
      uVar73 = uVar61;
      uVar74 = uVar62;
      uVar75 = uVar63;
      uVar76 = uVar64;
      do {
        ppVar51 = local_5400;
        local_5420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (uVar55 * 0x10);
        pgVar56 = local_53f8 + uVar55;
        auVar59[0] = -(pgVar56->m[0].n == uVar61);
        auVar59[1] = -(pgVar56->m[1].n == uVar62);
        auVar59[2] = -(pgVar56->m[2].n == uVar63);
        auVar59[3] = -(pgVar56->m[3].n == uVar64);
        auVar59[4] = -(pgVar56->m[4].n == uVar65);
        auVar59[5] = -(pgVar56->m[5].n == uVar66);
        auVar59[6] = -(pgVar56->m[6].n == uVar67);
        auVar59[7] = -(pgVar56->m[7].n == uVar68);
        auVar59[8] = -(pgVar56->m[8].n == uVar69);
        auVar59[9] = -(pgVar56->m[9].n == uVar70);
        auVar59[10] = -(pgVar56->m[10].n == uVar71);
        auVar59[0xb] = -(pgVar56->m[0xb].n == uVar72);
        auVar59[0xc] = -(pgVar56->m[0xc].n == uVar73);
        auVar59[0xd] = -(pgVar56->m[0xd].n == uVar74);
        auVar59[0xe] = -(pgVar56->m[0xe].n == uVar75);
        auVar59[0xf] = -(pgVar56->m[0xf].n == uVar76);
        local_5408 = uVar55;
        uVar24 = uVar61;
        uVar25 = uVar62;
        uVar26 = uVar63;
        uVar27 = uVar64;
        uVar28 = uVar65;
        uVar29 = uVar66;
        uVar30 = uVar67;
        uVar31 = uVar68;
        uVar32 = uVar69;
        uVar33 = uVar70;
        uVar34 = uVar71;
        uVar35 = uVar72;
        uVar36 = uVar73;
        uVar37 = uVar74;
        uVar38 = uVar75;
        uVar39 = uVar76;
        uVar3 = local_5388;
        uVar4 = uStack_5387;
        uVar5 = uStack_5386;
        uVar6 = uStack_5385;
        uVar7 = uStack_5384;
        uVar8 = uStack_5383;
        uVar9 = uStack_5382;
        uVar10 = uStack_5381;
        uVar11 = uStack_5380;
        uVar12 = uStack_537f;
        uVar13 = uStack_537e;
        uVar14 = uStack_537d;
        uVar15 = uStack_537c;
        uVar16 = uStack_537b;
        uVar17 = uStack_537a;
        uVar18 = uStack_5379;
        for (uVar50 = (uint)(ushort)((ushort)(SUB161(auVar59 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe);
            uStack_5379 = uVar39, uStack_537a = uVar38, uStack_537b = uVar37, uStack_537c = uVar36,
            uStack_537d = uVar35, uStack_537e = uVar34, uStack_537f = uVar33, uStack_5380 = uVar32,
            uStack_5381 = uVar31, uStack_5382 = uVar30, uStack_5383 = uVar29, uStack_5384 = uVar28,
            uStack_5385 = uVar27, uStack_5386 = uVar26, uStack_5387 = uVar25, local_5388 = uVar24,
            uVar50 != 0; uVar50 = uVar50 - 1 & uVar50) {
          iVar47 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> iVar47 & 1) == 0; iVar47 = iVar47 + 1) {
            }
          }
          bVar44 = (_func_result_type_void_ptr *)uVar22 ==
                   *(_func_result_type_void_ptr **)
                    ((long)&ppVar51[uVar55 * 0xf].first._M_string_length +
                    (ulong)(uint)(iVar47 << 6));
          uVar53 = (long)&ppVar51[uVar55 * 0xf].first._M_dataplus._M_p + (ulong)(uint)(iVar47 << 6);
          if (bVar44 && (_func_result_type_void_ptr *)uVar22 != (_func_result_type_void_ptr *)0x0) {
            iVar47 = bcmp(local_53f0,*(void **)uVar53,uVar22);
            bVar44 = iVar47 == 0;
            uVar61 = local_5388;
            uVar62 = uStack_5387;
            uVar63 = uStack_5386;
            uVar64 = uStack_5385;
            uVar65 = uStack_5384;
            uVar66 = uStack_5383;
            uVar67 = uStack_5382;
            uVar68 = uStack_5381;
            uVar69 = uStack_5380;
            uVar70 = uStack_537f;
            uVar71 = uStack_537e;
            uVar72 = uStack_537d;
            uVar73 = uStack_537c;
            uVar74 = uStack_537b;
            uVar75 = uStack_537a;
            uVar76 = uStack_5379;
          }
          uVar54 = local_543c;
          if (bVar44) goto LAB_001d9fa9;
          uVar24 = local_5388;
          uVar25 = uStack_5387;
          uVar26 = uStack_5386;
          uVar27 = uStack_5385;
          uVar28 = uStack_5384;
          uVar29 = uStack_5383;
          uVar30 = uStack_5382;
          uVar31 = uStack_5381;
          uVar32 = uStack_5380;
          uVar33 = uStack_537f;
          uVar34 = uStack_537e;
          uVar35 = uStack_537d;
          uVar36 = uStack_537c;
          uVar37 = uStack_537b;
          uVar38 = uStack_537a;
          uVar39 = uStack_5379;
          uVar3 = local_5388;
          uVar4 = uStack_5387;
          uVar5 = uStack_5386;
          uVar6 = uStack_5385;
          uVar7 = uStack_5384;
          uVar8 = uStack_5383;
          uVar9 = uStack_5382;
          uVar10 = uStack_5381;
          uVar11 = uStack_5380;
          uVar12 = uStack_537f;
          uVar13 = uStack_537e;
          uVar14 = uStack_537d;
          uVar15 = uStack_537c;
          uVar16 = uStack_537b;
          uVar17 = uStack_537a;
          uVar18 = uStack_5379;
        }
        local_5388 = uVar3;
        uStack_5387 = uVar4;
        uStack_5386 = uVar5;
        uStack_5385 = uVar6;
        uStack_5384 = uVar7;
        uStack_5383 = uVar8;
        uStack_5382 = uVar9;
        uStack_5381 = uVar10;
        uStack_5380 = uVar11;
        uStack_537f = uVar12;
        uStack_537e = uVar13;
        uStack_537d = uVar14;
        uStack_537c = uVar15;
        uStack_537b = uVar16;
        uStack_537a = uVar17;
        uStack_5379 = uVar18;
        if ((local_53f8->m[(long)((long)&local_5420->_M_string_length + 7)].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar48 & 7]) == 0) break;
        paVar2 = &(in_R9.values_)->field_0;
        in_R9.values_ = (value<fmt::v11::context> *)((long)&(in_R9.values_)->field_0 + 1);
        uVar55 = (ulong)((long)paVar2 + local_5408 + 1) & (ulong)local_5410;
      } while (in_R9.values_ <= local_5410);
      uVar53 = (undefined8 *)0x0;
LAB_001d9fa9:
      local_53e8 = (undefined8 *)uVar53;
      if ((undefined8 *)uVar53 == (undefined8 *)0x0) {
        local_3e68._0_8_ = local_3e68 + 0x10;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e68
                     ,0x10,'\0');
        uVar55 = 0x11;
        pcVar57 = (char *)local_3e68._0_8_;
        do {
          rVar49 = std::
                   mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                   ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                 *)&local_13c0);
          uVar22 = local_51f0._8_8_;
          *pcVar57 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar49 % 0x3e]
          ;
          pcVar57 = pcVar57 + 1;
          uVar55 = uVar55 - 1;
        } while (1 < uVar55);
        local_53f0 = (path *)local_51f0._0_8_;
        local_5420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     detail::hashing::hash((void *)local_51f0._0_8_,local_51f0._8_8_);
        pgVar56 = (group_type_pointer)((ulong)local_5420 >> ((byte)local_53e0[0] & 0x3f));
        uVar53 = local_53e0._16_8_;
        lVar58 = ((ulong)local_5420 & 0xff) * 4;
        uVar61 = (&UNK_0049b57c)[lVar58];
        uVar62 = (&UNK_0049b57d)[lVar58];
        uVar63 = (&UNK_0049b57e)[lVar58];
        uVar64 = (&UNK_0049b57f)[lVar58];
        uVar55 = (ulong)((uint)local_5420 & 7);
        args_1._M_extent_value = 0;
        ppVar51 = ppStack_53c8;
        pbVar52 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_53e0._8_8_;
        uVar65 = uVar61;
        uVar66 = uVar62;
        uVar67 = uVar63;
        uVar68 = uVar64;
        uVar69 = uVar61;
        uVar70 = uVar62;
        uVar71 = uVar63;
        uVar72 = uVar64;
        uVar73 = uVar61;
        uVar74 = uVar62;
        uVar75 = uVar63;
        uVar76 = uVar64;
        local_53f8 = pgVar56;
        do {
          in_R9.values_ = (value<fmt::v11::context> *)((long)pgVar56 * 0x10);
          pgVar1 = (group_type_pointer)(uVar53 + pgVar56 * 0x10);
          auVar60[0] = -(pgVar1->m[0].n == uVar61);
          auVar60[1] = -(pgVar1->m[1].n == uVar62);
          auVar60[2] = -(pgVar1->m[2].n == uVar63);
          auVar60[3] = -(pgVar1->m[3].n == uVar64);
          auVar60[4] = -(pgVar1->m[4].n == uVar65);
          auVar60[5] = -(pgVar1->m[5].n == uVar66);
          auVar60[6] = -(pgVar1->m[6].n == uVar67);
          auVar60[7] = -(pgVar1->m[7].n == uVar68);
          auVar60[8] = -(pgVar1->m[8].n == uVar69);
          auVar60[9] = -(pgVar1->m[9].n == uVar70);
          auVar60[10] = -(pgVar1->m[10].n == uVar71);
          auVar60[0xb] = -(pgVar1->m[0xb].n == uVar72);
          auVar60[0xc] = -(pgVar1->m[0xc].n == uVar73);
          auVar60[0xd] = -(pgVar1->m[0xd].n == uVar74);
          auVar60[0xe] = -(pgVar1->m[0xe].n == uVar75);
          auVar60[0xf] = -(pgVar1->m[0xf].n == uVar76);
          aVar40.values_ = in_R9.values_;
          ppVar41 = ppVar51;
          pgVar42 = pgVar56;
          pbVar43 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    args_1._M_extent_value;
          uVar24 = uVar61;
          uVar25 = uVar62;
          uVar26 = uVar63;
          uVar27 = uVar64;
          uVar28 = uVar65;
          uVar29 = uVar66;
          uVar30 = uVar67;
          uVar31 = uVar68;
          uVar32 = uVar69;
          uVar33 = uVar70;
          uVar34 = uVar71;
          uVar35 = uVar72;
          uVar36 = uVar73;
          uVar37 = uVar74;
          uVar38 = uVar75;
          uVar39 = uVar76;
          ppVar19 = local_5400;
          uVar3 = local_5388;
          uVar4 = uStack_5387;
          uVar5 = uStack_5386;
          uVar6 = uStack_5385;
          uVar7 = uStack_5384;
          uVar8 = uStack_5383;
          uVar9 = uStack_5382;
          uVar10 = uStack_5381;
          uVar11 = uStack_5380;
          uVar12 = uStack_537f;
          uVar13 = uStack_537e;
          uVar14 = uStack_537d;
          uVar15 = uStack_537c;
          uVar16 = uStack_537b;
          uVar17 = uStack_537a;
          uVar18 = uStack_5379;
          aVar20 = local_5378;
          pbVar21 = local_5370;
          pgVar1 = local_5368;
          for (uVar50 = (uint)(ushort)((ushort)(SUB161(auVar60 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe);
              uStack_5379 = uVar39, uStack_537a = uVar38, uStack_537b = uVar37, uStack_537c = uVar36
              , uStack_537d = uVar35, uStack_537e = uVar34, uStack_537f = uVar33,
              uStack_5380 = uVar32, uStack_5381 = uVar31, uStack_5382 = uVar30, uStack_5383 = uVar29
              , uStack_5384 = uVar28, uStack_5385 = uVar27, uStack_5386 = uVar26,
              uStack_5387 = uVar25, local_5388 = uVar24, local_5370 = pbVar43, local_5368 = pgVar42,
              local_5400 = ppVar41, local_5378 = aVar40, uVar50 != 0; uVar50 = uVar50 - 1 & uVar50)
          {
            iVar47 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> iVar47 & 1) == 0; iVar47 = iVar47 + 1) {
              }
            }
            bVar44 = (_func_result_type_void_ptr *)uVar22 ==
                     *(_func_result_type_void_ptr **)
                      ((long)&ppVar51[(long)pgVar56 * 0xf].first._M_string_length +
                      (ulong)(uint)(iVar47 << 6));
            puVar23 = (undefined8 *)
                      ((long)&ppVar51[(long)pgVar56 * 0xf].first._M_dataplus._M_p +
                      (ulong)(uint)(iVar47 << 6));
            local_5410 = pbVar52;
            local_5408 = uVar55;
            if (bVar44 && (_func_result_type_void_ptr *)uVar22 != (_func_result_type_void_ptr *)0x0)
            {
              iVar47 = bcmp(local_53f0,(void *)*puVar23,uVar22);
              bVar44 = iVar47 == 0;
              uVar61 = local_5388;
              uVar62 = uStack_5387;
              uVar63 = uStack_5386;
              uVar64 = uStack_5385;
              uVar65 = uStack_5384;
              uVar66 = uStack_5383;
              uVar67 = uStack_5382;
              uVar68 = uStack_5381;
              uVar69 = uStack_5380;
              uVar70 = uStack_537f;
              uVar71 = uStack_537e;
              uVar72 = uStack_537d;
              uVar73 = uStack_537c;
              uVar74 = uStack_537b;
              uVar75 = uStack_537a;
              uVar76 = uStack_5379;
            }
            uVar54 = local_543c;
            if (bVar44) goto LAB_001da21d;
            aVar40 = local_5378;
            ppVar41 = local_5400;
            uVar55 = local_5408;
            pgVar42 = local_5368;
            pbVar52 = local_5410;
            pbVar43 = local_5370;
            uVar24 = local_5388;
            uVar25 = uStack_5387;
            uVar26 = uStack_5386;
            uVar27 = uStack_5385;
            uVar28 = uStack_5384;
            uVar29 = uStack_5383;
            uVar30 = uStack_5382;
            uVar31 = uStack_5381;
            uVar32 = uStack_5380;
            uVar33 = uStack_537f;
            uVar34 = uStack_537e;
            uVar35 = uStack_537d;
            uVar36 = uStack_537c;
            uVar37 = uStack_537b;
            uVar38 = uStack_537a;
            uVar39 = uStack_5379;
            ppVar19 = local_5400;
            uVar3 = local_5388;
            uVar4 = uStack_5387;
            uVar5 = uStack_5386;
            uVar6 = uStack_5385;
            uVar7 = uStack_5384;
            uVar8 = uStack_5383;
            uVar9 = uStack_5382;
            uVar10 = uStack_5381;
            uVar11 = uStack_5380;
            uVar12 = uStack_537f;
            uVar13 = uStack_537e;
            uVar14 = uStack_537d;
            uVar15 = uStack_537c;
            uVar16 = uStack_537b;
            uVar17 = uStack_537a;
            uVar18 = uStack_5379;
            aVar20 = local_5378;
            pbVar21 = local_5370;
            pgVar1 = local_5368;
          }
          in_R9.values_ =
               (value<fmt::v11::context> *)
               ((slot_type *)uVar53 + (long)&(local_5378.values_)->field_0);
          args_1._M_extent_value = (size_t)local_5370;
          local_5388 = uVar3;
          uStack_5387 = uVar4;
          uStack_5386 = uVar5;
          uStack_5385 = uVar6;
          uStack_5384 = uVar7;
          uStack_5383 = uVar8;
          uStack_5382 = uVar9;
          uStack_5381 = uVar10;
          uStack_5380 = uVar11;
          uStack_537f = uVar12;
          uStack_537e = uVar13;
          uStack_537d = uVar14;
          uStack_537c = uVar15;
          uStack_537b = uVar16;
          uStack_537a = uVar17;
          uStack_5379 = uVar18;
          local_5378 = aVar20;
          if ((*(byte *)((long)&(in_R9.values_)->field_0 + 0xf) &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[uVar55]) == 0) break;
          args_1._M_extent_value = (long)&(local_5370->_M_dataplus)._M_p + 1;
          pgVar56 = (group_type_pointer)
                    ((ulong)(local_5368->m + 1 + (long)&(local_5370->_M_dataplus)._M_p) &
                    (ulong)pbVar52);
          ppVar51 = local_5400;
          local_5400 = ppVar19;
          local_5370 = pbVar21;
          local_5368 = pgVar1;
        } while (args_1._M_extent_value <= pbVar52);
        local_5418 = (undefined8 *)0x0;
        puVar23 = local_5418;
        local_5400 = ppVar19;
        local_5370 = pbVar21;
        local_5368 = pgVar1;
LAB_001da21d:
        local_5418 = puVar23;
        uVar53 = local_5418;
        if (local_5418 == (undefined8 *)0x0) {
          if (local_53b8 < local_53c0) {
            in_R9.values_ = (value<fmt::v11::context> *)&local_543d;
            args_1._M_extent_value = (size_t)local_5420;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::__cxx11::string&>
                      ((locator *)local_2748,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_53e0,(arrays_type *)local_53e0,(size_t)local_53f8,(size_t)local_5420
                       ,(try_emplace_args_t *)in_R9.values_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_51f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3e68);
            local_53b8 = local_53b8 + 1;
            uVar53 = local_2748[0].field_2._M_allocated_capacity;
          }
          else {
            args_1._M_extent_value = (size_t)local_51f0;
            in_R9.values_ = (value<fmt::v11::context> *)local_3e68;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::__cxx11::string&>
                      ((locator *)local_2748,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_53e0,(size_t)local_5420,&local_543d,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       args_1._M_extent_value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_R9.values_);
            uVar53 = local_2748[0].field_2._M_allocated_capacity;
          }
        }
        if ((undefined1 *)local_3e68._0_8_ != local_3e68 + 0x10) {
          operator_delete((void *)local_3e68._0_8_,local_3e68._16_8_ + 1);
        }
      }
      sVar77._M_str = *(char **)(uVar53 + 0x20);
      sVar77._M_len = *(undefined8 *)(uVar53 + 0x28);
      local_5438._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._0_16_ =
           parsing::Token::withRawText((Token *)&local_5438,&local_53b0,sVar77);
      if ((path *)local_51f0._0_8_ != local_51e0) {
        operator_delete((void *)local_51f0._0_8_,
                        (long)local_51e0[0]._M_pathname._M_dataplus._M_p + 1);
      }
    }
    slang::syntax::SyntaxPrinter::print
              (&local_5358,
               (Token)local_5438._M_v.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._0_16_);
  } while ((TokenKind)
           local_5438._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start != EndOfFile);
  bVar44 = (pointer)local_52e8._8_8_ == (pointer)0x0;
  if (!bVar44) {
    lVar58 = local_52e8._8_8_ * 0x70;
    this_00 = (SourceManager *)local_52e8._0_8_;
    do {
      bVar45 = Diagnostic::isError((Diagnostic *)this_00);
      if (bVar45) {
        diags._M_extent._M_extent_value = args_1._M_extent_value;
        diags._M_ptr = (pointer)local_52e8._8_8_;
        DiagnosticEngine::reportAll_abi_cxx11_
                  ((string *)local_3e68,local_5360,(SourceManager *)local_52e8._0_8_,diags);
        local_2748[0]._M_dataplus._M_p = (pointer)local_3e68._0_8_;
        local_2748[0]._M_string_length = local_3e68._8_8_;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_2748;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x2;
        args_1._M_extent_value = (size_t)local_2748;
        ::fmt::v11::vformat_abi_cxx11_((string *)local_51f0,(v11 *)0x488480,fmt,args);
        text._M_str = (char *)local_51f0._0_8_;
        text._M_len = local_51f0._8_8_;
        ctx = (path *)local_51f0._0_8_;
        OS::printE(text);
        if ((path *)local_51f0._0_8_ != local_51e0) {
          ctx = (path *)((long)local_51e0[0]._M_pathname._M_dataplus._M_p + 1);
          operator_delete((void *)local_51f0._0_8_,(size_t)ctx);
        }
        if ((undefined1 *)local_3e68._0_8_ != local_3e68 + 0x10) {
          ctx = (path *)(local_3e68._16_8_ + 1);
          operator_delete((void *)local_3e68._0_8_,(size_t)ctx);
        }
        if (bVar45) goto LAB_001da4bf;
      }
      this_00 = (SourceManager *)&this_00->bufferEntries;
      lVar58 = lVar58 + -0x70;
      bVar44 = lVar58 == 0;
    } while (!bVar44);
  }
  local_3e68._0_8_ = local_3e68 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e68,local_5358.buffer._M_dataplus._M_p,
             local_5358.buffer._M_dataplus._M_p + local_5358.buffer._M_string_length);
  local_2748[0]._M_dataplus._M_p = (pointer)local_3e68._0_8_;
  local_2748[0]._M_string_length = local_3e68._8_8_;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)local_2748;
  fmt_00.size_ = 0xd;
  fmt_00.data_ = (char *)0x3;
  ::fmt::v11::vformat_abi_cxx11_((string *)local_51f0,(v11 *)0x49af4c,fmt_00,args_00);
  text_00._M_str = (char *)local_51f0._0_8_;
  text_00._M_len = local_51f0._8_8_;
  ctx = (path *)local_51f0._0_8_;
  OS::print(text_00);
  if ((path *)local_51f0._0_8_ != local_51e0) {
    ctx = (path *)((long)local_51e0[0]._M_pathname._M_dataplus._M_p + 1);
    operator_delete((void *)local_51f0._0_8_,(size_t)ctx);
  }
  if ((undefined1 *)local_3e68._0_8_ != local_3e68 + 0x10) {
    ctx = (path *)(local_3e68._16_8_ + 1);
    operator_delete((void *)local_3e68._0_8_,(size_t)ctx);
  }
LAB_001da4bf:
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_53e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5358.buffer._M_dataplus._M_p != &local_5358.buffer.field_2) {
    ctx = (path *)(CONCAT71(local_5358.buffer.field_2._M_allocated_capacity._1_7_,
                            local_5358.buffer.field_2._M_local_buf[0]) + 1);
    operator_delete(local_5358.buffer._M_dataplus._M_p,(size_t)ctx);
  }
  if (local_53a0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ctx = (path *)((long)local_53a0.
                         super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_53a0.
                        super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_53a0.
                    super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                    _M_impl.super__Vector_impl_data._M_start,(size_t)ctx);
  }
  parsing::Preprocessor::~Preprocessor(&local_2ae0);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)local_52e8,(EVP_PKEY_CTX *)ctx);
  BumpAllocator::~BumpAllocator(&local_53b0);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)local_5318);
  return bVar44;
}

Assistant:

bool Driver::runPreprocessor(bool includeComments, bool includeDirectives, bool obfuscateIds,
                             bool useFixedObfuscationSeed) {
    Bag optionBag;
    addParseOptions(optionBag);

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, optionBag);

    auto buffers = sourceLoader.loadSources();
    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    SyntaxPrinter output;
    output.setIncludeComments(includeComments);
    output.setIncludeDirectives(includeDirectives);

    std::optional<std::mt19937> rng;
    flat_hash_map<std::string, std::string> obfuscationMap;

    if (obfuscateIds) {
        if (useFixedObfuscationSeed)
            rng.emplace();
        else
            rng = createRandomGenerator<std::mt19937>();
    }

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::IntegerBase) {
            // This is needed for the case where obfuscation is enabled,
            // the digits of a vector literal may be lexed initially as
            // an identifier and we don't have the parser here to fix things
            // up for us.
            do {
                output.print(token);
                token = preprocessor.next();
            } while (SyntaxFacts::isPossibleVectorDigit(token.kind));
        }

        if (obfuscateIds && token.kind == TokenKind::Identifier) {
            auto name = std::string(token.valueText());
            auto translation = obfuscationMap.find(name);
            if (translation == obfuscationMap.end()) {
                auto newName = generateRandomAlphanumericString(*rng, 16);
                translation = obfuscationMap.emplace(name, newName).first;
            }
            token = token.withRawText(alloc, translation->second);
        }

        output.print(token);
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    // Only print diagnostics if actual errors occurred.
    for (auto& diag : diagnostics) {
        if (diag.isError()) {
            OS::printE(fmt::format("{}", DiagnosticEngine::reportAll(sourceManager, diagnostics)));
            return false;
        }
    }

    OS::print(fmt::format("{}\n", output.str()));
    return true;
}